

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfo.cpp
# Opt level: O2

QString * __thiscall QFileInfo::absoluteFilePath(QString *__return_storage_ptr__,QFileInfo *this)

{
  QFileInfoPrivate *this_00;
  
  this_00 = (this->d_ptr).d.ptr;
  if ((this_00->field_0x1db & 0x40) == 0) {
    QFileInfoPrivate::getFileName(__return_storage_ptr__,this_00,AbsoluteName);
  }
  else {
    QString::QString(__return_storage_ptr__,(QLatin1StringView)ZEXT816(0x165fe7));
  }
  return __return_storage_ptr__;
}

Assistant:

QString QFileInfo::absoluteFilePath() const
{
    Q_D(const QFileInfo);
    if (d->isDefaultConstructed)
        return ""_L1;
    return d->getFileName(QAbstractFileEngine::AbsoluteName);
}